

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_hash_set_unittests.cc
# Opt level: O3

void __thiscall
DenseHashSet_TestEmplaceHintAfterDelete_Test::~DenseHashSet_TestEmplaceHintAfterDelete_Test
          (DenseHashSet_TestEmplaceHintAfterDelete_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DenseHashSet, TestEmplaceHintAfterDelete) {
	dense_hash_set<const char *> set;

	const char * deleted_ptr = "";
	const char * str1 = "Hello";

	set.set_empty_key(nullptr);
	set.set_deleted_key(deleted_ptr);

	auto insertion_result = set.insert(str1);
	auto str1_inserted_it = insertion_result.first;

	auto deleted_iterator = set.erase(str1_inserted_it);
	set.emplace_hint(deleted_iterator, str1);
}